

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jzon.cpp
# Opt level: O0

double __thiscall Jzon::Node::toDouble(Node *this,double def)

{
  Data *pDVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  Node *local_1b0;
  double val;
  stringstream sstr;
  double def_local;
  Node *this_local;
  
  bVar2 = isNumber(this);
  this_local = (Node *)def;
  if (bVar2) {
    pDVar1 = this->data;
    _Var3 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream((stringstream *)&val,(string *)&pDVar1->valueStr,_Var3)
    ;
    std::istream::operator>>((stringstream *)&val,(double *)&local_1b0);
    this_local = local_1b0;
    std::__cxx11::stringstream::~stringstream((stringstream *)&val);
  }
  return (double)this_local;
}

Assistant:

double Node::toDouble(double def) const { GET_NUMBER(double) }